

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall
AmpIO::ReadWaveformTable(AmpIO *this,quadlet_t *buffer,unsigned_short offset,unsigned_short nquads)

{
  BasePort *pBVar1;
  unsigned_short i;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((uVar2 < 7) || (uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar2 == 0x64524131)) {
    return false;
  }
  if (nquads != 0) {
    uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
    if (0x3ff < offset) {
      return false;
    }
    if (uVar3 >> 2 < (uint)nquads) {
      return false;
    }
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    iVar4 = (*pBVar1->_vptr_BasePort[0x26])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                       (ulong)(offset | 0x8000),buffer,(ulong)((uint)nquads * 4));
    if ((char)iVar4 == '\0') {
      return false;
    }
    uVar5 = 0;
    do {
      uVar3 = buffer[uVar5] ^ 0xf000000;
      buffer[uVar5] =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | buffer[uVar5] << 0x18;
      uVar5 = uVar5 + 1;
    } while (nquads != uVar5);
  }
  return true;
}

Assistant:

bool AmpIO::ReadWaveformTable(quadlet_t *buffer, unsigned short offset, unsigned short nquads)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    if (nquads == 0) return true;
    if (nquads > (port->GetMaxReadDataSize()/sizeof(quadlet_t))) return false;
    if (offset > 1023) return false;
    nodeaddr_t address = 0x8000 + offset;   // ADDR_WAVEFORM = 0x8000
    bool ret = port->ReadBlock(BoardId, address, buffer, nquads*sizeof(quadlet_t));
    if (ret) {
        // Byteswap and invert digital output bits (see WriteDigitalOutput and GetDigitalOutput)
        for (unsigned short i = 0; i < nquads; i++)
            buffer[i] = bswap_32(buffer[i])^0x0000000f;
    }
    return ret;
}